

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O3

bool __thiscall
SharedMemRingBuffer::CommitRead(SharedMemRingBuffer *this,size_t user_id,int64_t index)

{
  LOCK();
  this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[user_id].super___atomic_base<long>
  ._M_i = index;
  UNLOCK();
  return true;
}

Assistant:

bool  SharedMemRingBuffer::CommitRead(size_t user_id, int64_t index)
{
    ring_buffer_status_on_shared_mem_->array_consumer_indexes[user_id] = index ; //update

#if 0
    char szMsg[100];
    snprintf(szMsg, sizeof(szMsg), 
            "[id:%d]     \t\t\t\t\t\t\t\t\t\t\t\t[%s-%d] index[%" PRId64 "] ", user_id, __func__, __LINE__, index );
    {AtomicPrint atomicPrint(szMsg);}
#endif
    return true;
}